

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeDensityZ.cpp
# Opt level: O2

void __thiscall OpenMD::ChargeDensityZ::process(ChargeDensityZ *this)

{
  Mat3x3d *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_01;
  _Rb_tree_header *p_Var1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  SimInfo *info;
  Snapshot *this_02;
  double *pdVar8;
  double *pdVar9;
  pointer pdVar10;
  pointer ppAVar11;
  pointer ppAVar12;
  bool bVar13;
  int iVar14;
  double *pdVar15;
  _Base_ptr p_Var16;
  StuntDouble *this_03;
  pointer ppAVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  mapped_type_conflict *pmVar20;
  mapped_type *pmVar21;
  pointer pdVar22;
  long lVar23;
  ulong uVar24;
  AtomType *this_04;
  ulong uVar25;
  long lVar26;
  long lVar27;
  RealType RVar28;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *pmVar29;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  double dVar37;
  double dVar38;
  mapped_type_conflict local_1430;
  double local_1428;
  double local_1420;
  RealType q;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_1410;
  mapped_type_conflict local_1408;
  RealType local_1400;
  mapped_type_conflict local_13f8;
  string atomName;
  int globalIndex;
  mapped_type_conflict local_13b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *local_13b0;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_13a8;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *local_13a0;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *local_1398;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *local_1390;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *local_1388;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1380;
  double local_1378;
  int kk;
  SelectionManager *local_1368;
  undefined8 uStack_1360;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_1358;
  _Rb_tree_node_base *local_1350;
  Vector3d pos;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> atChain;
  vector<int,_std::allocator<int>_> cartesian_axis;
  set<int,_std::less<int>,_std::allocator<int>_> axisValues;
  DumpReader reader;
  
  info = (this->super_StaticAnalyser).info_;
  local_1378 = (double)CONCAT71(local_1378._1_7_,
                                (info->simParams_->UsePeriodicBoundaryConditions).
                                super_ParameterBase.field_0x2b);
  DumpReader::DumpReader(&reader,info,&(this->super_StaticAnalyser).dumpFilename_);
  iVar14 = DumpReader::getNFrames(&reader);
  local_13f8 = (mapped_type_conflict)CONCAT44(local_13f8._4_4_,iVar14);
  this->nProcessed_ = iVar14 / (this->super_StaticAnalyser).step_;
  DumpReader::readFrame(&reader,1);
  this_02 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
  this->currentSnapshot_ = this_02;
  Snapshot::getHmat((Mat3x3d *)&axisValues,this_02);
  this_00 = &this->hmat_;
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)this_00,(RectMatrix<double,_3U,_3U> *)&axisValues);
  std::vector<double,_std::allocator<double>_>::push_back
            (&this->zBox_,
             (value_type_conflict2 *)
             ((long)(this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                    data_ + (ulong)(uint)this->axis_ * 0x20));
  pdVar8 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_1420 = 0.0;
  for (pdVar15 = pdVar8; pdVar15 != pdVar9; pdVar15 = pdVar15 + 1) {
    local_1420 = local_1420 + *pdVar15;
  }
  p_Var1 = &axisValues._M_t._M_impl.super__Rb_tree_header;
  axisValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  axisValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  axisValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  atomName._M_dataplus._M_p = (pointer)((ulong)atomName._M_dataplus._M_p._4_4_ << 0x20);
  axisValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  axisValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&axisValues._M_t,(int *)&atomName);
  atomName._M_dataplus._M_p._0_4_ = 1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&axisValues._M_t,(int *)&atomName);
  atomName._M_dataplus._M_p._0_4_ = 2;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&axisValues._M_t,(int *)&atomName);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
            (&axisValues._M_t,&this->axis_);
  lVar26 = (long)pdVar9 - (long)pdVar8;
  lVar27 = lVar26 >> 3;
  auVar31._8_4_ = (int)(lVar26 >> 0x23);
  auVar31._0_8_ = lVar27;
  auVar31._12_4_ = 0x45300000;
  local_1420 = local_1420 /
               ((auVar31._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar27) - 4503599627370496.0));
  cartesian_axis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cartesian_axis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cartesian_axis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (p_Var16 = axisValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var16 != p_Var1; p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
    std::vector<int,_std::allocator<int>_>::push_back
              (&cartesian_axis,(value_type_conflict *)(p_Var16 + 1));
  }
  uVar5 = *cartesian_axis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->x_ = uVar5;
  uVar6 = cartesian_axis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[1];
  this->y_ = uVar6;
  dVar2 = *(double *)
           ((long)(this_00->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
           (ulong)uVar5 * 0x20);
  dVar3 = *(double *)
           ((long)(this_00->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
           (ulong)uVar6 * 0x20);
  lVar26 = (long)(this->densityZAverageAllFrame_).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish -
           (long)(this->densityZAverageAllFrame_).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
  lVar27 = lVar26 >> 3;
  auVar35._8_4_ = (int)(lVar26 >> 0x23);
  auVar35._0_8_ = lVar27;
  auVar35._12_4_ = 0x45300000;
  local_1368 = &this->seleMan_;
  local_1380 = &this->atomNameGlobalIndex_;
  local_1410 = &this->countUsingGlobalIndex_;
  local_13a8 = &this->averageChargeUsingGlobalIndex_;
  local_13a0 = &this->totalChargeUsingGlobalIndex_;
  local_1398 = &this->zPosUsingGlobalIndex_;
  local_1388 = &this->xPosUsingGlobalIndex_;
  local_1390 = &this->yPosUsingGlobalIndex_;
  local_1358 = &this->vanderRUsingGlobalIndex_;
  local_1350 = &(this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header;
  this_01 = &this->SDCount_;
  local_13b0 = &this->averageChargeForEachType_;
  iVar14 = 1;
  do {
    if (local_13f8._0_4_ <= iVar14) {
      local_1388 = (map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    *)(local_1420 * 0.5);
      for (p_Var16 = (this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left; p_Var16 != local_1350;
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
        pos.super_Vector<double,_3U>.data_[0] =
             (double)CONCAT44(pos.super_Vector<double,_3U>.data_[0]._4_4_,p_Var16[1]._M_color);
        std::__cxx11::string::string((string *)&atomName,(string *)&p_Var16[1]._M_parent);
        pmVar20 = std::
                  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                  operator[](local_13a8,(key_type *)&pos);
        local_13b8 = *pmVar20;
        pmVar20 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  ::operator[](local_13b0,&atomName);
        local_13f8 = *pmVar20;
        pmVar20 = std::
                  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                  operator[](local_1358,(key_type *)&pos);
        dVar4 = *pmVar20;
        local_1410 = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     (dVar4 * 6.283185307179586 * dVar4);
        local_1378 = dVar4 * dVar4 + dVar4 * dVar4;
        local_1380 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)SQRT((double)local_1410);
        uVar25 = 0;
        while( true ) {
          pmVar21 = std::
                    map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](local_1398,(key_type *)&pos);
          if ((ulong)((long)(pmVar21->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(pmVar21->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3) <= uVar25) break;
          pmVar21 = std::
                    map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](local_1398,(key_type *)&pos);
          local_1400 = (pmVar21->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar25];
          pmVar21 = std::
                    map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](local_13a0,(key_type *)&pos);
          dVar4 = (pmVar21->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar25];
          dVar34 = ABS(dVar4 - local_13b8);
          local_1428 = dVar34;
          if (dVar34 <= 1e-10) {
            local_1428 = 0.0;
          }
          dVar36 = dVar4 - local_13f8;
          dVar37 = ABS(dVar36);
          dVar38 = dVar37;
          if (dVar37 <= 1e-10) {
            dVar38 = 0.0;
          }
          local_1368 = (SelectionManager *)(-(ulong)(1e-10 < dVar34) & (ulong)(dVar4 - local_13b8));
          uStack_1360 = 0;
          local_1408 = dVar38 * dVar38;
          pdVar22 = (this->densityFlucZAverageAllFrame_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          for (uVar24 = 0;
              uVar24 < (ulong)((long)(this->densityFlucZAverageAllFrame_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar22 >> 3);
              uVar24 = uVar24 + 1) {
            auVar32._8_4_ = (int)(uVar24 >> 0x20);
            auVar32._0_8_ = uVar24;
            auVar32._12_4_ = 0x45300000;
            lVar26 = (long)(this->densityZAverageAllFrame_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->densityZAverageAllFrame_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
            lVar23 = lVar26 >> 3;
            auVar33._8_4_ = (int)(lVar26 >> 0x23);
            auVar33._0_8_ = lVar23;
            auVar33._12_4_ = 0x45300000;
            dVar34 = local_1400 -
                     ((((auVar32._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar24) - 4503599627370496.0)) * local_1420
                      ) / ((auVar33._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar23) - 4503599627370496.0)) -
                     (double)local_1388);
            pmVar29 = (map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                       *)exp((-dVar34 * dVar34) / local_1378);
            pmVar30 = local_1380;
            if ((double)local_1410 < 0.0) {
              local_1390 = pmVar29;
              pmVar30 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)sqrt((double)local_1410);
              pmVar29 = local_1390;
            }
            dVar34 = (double)pmVar29 /
                     ((double)pmVar30 *
                     (local_1420 /
                     ((auVar35._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar27) - 4503599627370496.0))) *
                     dVar2 * dVar3);
            pdVar22 = (this->densityZAverageAllFrame_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar22[uVar24] = dVar4 * dVar34 + pdVar22[uVar24];
            pdVar22 = (this->densityFlucZAverageAllFrame_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar22[uVar24] = (double)local_1368 * dVar34 + pdVar22[uVar24];
            pdVar10 = (this->absDensityFlucZAverageAllFrame_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar10[uVar24] = local_1428 * local_1428 * dVar34 + pdVar10[uVar24];
            pdVar10 = (this->densityFlucZAverageFirstFrame_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar10[uVar24] =
                 (double)(-(ulong)(1e-10 < dVar37) & (ulong)dVar36) * dVar34 + pdVar10[uVar24];
            pdVar10 = (this->absDensityFlucZAverageFirstFrame_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar10[uVar24] = dVar34 * local_1408 + pdVar10[uVar24];
          }
          uVar25 = uVar25 + 1;
        }
        std::__cxx11::string::~string((string *)&atomName);
      }
      (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
      if (this->genXYZ_ == true) {
        (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[5])(this);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&cartesian_axis.super__Vector_base<int,_std::allocator<int>_>);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&axisValues._M_t);
      DumpReader::~DumpReader(&reader);
      return;
    }
    local_13b8 = (mapped_type_conflict)CONCAT44(local_13b8._4_4_,iVar14);
    DumpReader::readFrame(&reader,iVar14);
    this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    if ((this->evaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&atomName,&this->evaluator_);
      SelectionManager::setSelectionSet(local_1368,(SelectionSet *)&atomName);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&atomName);
    }
    this_03 = SelectionManager::beginSelected(local_1368,&kk);
    while (this_03 != (StuntDouble *)0x0) {
      if (this_03->objType_ < otRigidBody) {
        this_04 = (AtomType *)this_03[1]._vptr_StuntDouble;
LAB_00179ad3:
        q = 0.0;
        atomName._M_dataplus._M_p = (pointer)this_04;
        bVar13 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)&atomName);
        if (bVar13) {
          RVar28 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)&atomName);
          q = RVar28 + q;
        }
        pos.super_Vector<double,_3U>.data_[0] = (double)this_04;
        bVar13 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)&pos);
        if (bVar13) {
          q = *(double *)
               (*(long *)((long)&(this_03->snapshotMan_->currentSnapshot_->atomData).flucQPos.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + this_03->storage_) +
               (long)this_03->localIndex_ * 8) + q;
        }
      }
      else {
        memcpy(&painCave,"Can not calculate charge density distribution if it is not atom\n",0x41);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
        q = 0.0;
        this_04 = (AtomType *)this_03[1]._vptr_StuntDouble;
        if (this_03->objType_ < otRigidBody) goto LAB_00179ad3;
      }
      atomName._M_dataplus._M_p = (pointer)&atomName.field_2;
      atomName._M_string_length = 0;
      atomName.field_2._M_local_buf[0] = '\0';
      AtomType::allYourBase(&atChain,this_04);
      ppAVar12 = atChain.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      do {
        ppAVar17 = ppAVar12;
        ppAVar11 = atChain.
                   super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (ppAVar17 ==
            atChain.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_1430 = 0.0;
          goto LAB_00179bf1;
        }
        AtomType::getName_abi_cxx11_((string *)&pos,*ppAVar17);
        std::__cxx11::string::assign((char *)&atomName);
        std::__cxx11::string::~string((string *)&pos);
        AtomType::getName_abi_cxx11_((string *)&pos,*ppAVar17);
        iVar14 = ElementsTable::GetAtomicNum
                           ((ElementsTable *)etab,(char *)pos.super_Vector<double,_3U>.data_[0]);
        std::__cxx11::string::~string((string *)&pos);
        ppAVar12 = ppAVar17 + 1;
      } while (iVar14 == 0);
      local_1430 = ElementsTable::GetVdwRad((ElementsTable *)etab,iVar14);
LAB_00179bf1:
      if (ppAVar17 == ppAVar11) {
        local_1430 = this->vRadius_;
      }
      StuntDouble::getPos(&pos,this_03);
      if (local_1378._0_1_ != '\0') {
        Snapshot::wrapVector(this->currentSnapshot_,&pos);
      }
      StuntDouble::setPos(this_03,&pos);
      StuntDouble::getPos((Vector3d *)&globalIndex,this_03);
      Vector<double,_3U>::operator=((Vector<double,_3U> *)&pos,(Vector<double,_3U> *)&globalIndex);
      globalIndex = this_03->globalIndex_;
      pmVar18 = std::
                map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](local_1380,(key_type *)&globalIndex);
      std::__cxx11::string::_M_assign((string *)pmVar18);
      pmVar19 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](local_1410,&globalIndex);
      iVar14 = *pmVar19;
      pmVar20 = std::
                map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                operator[](local_13a8,&globalIndex);
      local_1408 = *pmVar20;
      local_1400 = q;
      pmVar19 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](local_1410,&globalIndex);
      iVar7 = *pmVar19;
      pmVar20 = std::
                map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                operator[](local_13a8,&globalIndex);
      *pmVar20 = ((double)iVar14 * local_1408 + local_1400) / (double)(iVar7 + 1);
      pmVar21 = std::
                map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                ::operator[](local_13a0,&globalIndex);
      std::vector<double,_std::allocator<double>_>::push_back(pmVar21,&q);
      pmVar21 = std::
                map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                ::operator[](local_1398,&globalIndex);
      std::vector<double,_std::allocator<double>_>::push_back
                (pmVar21,pos.super_Vector<double,_3U>.data_ + (uint)this->axis_);
      pmVar21 = std::
                map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                ::operator[](local_1388,&globalIndex);
      std::vector<double,_std::allocator<double>_>::push_back
                (pmVar21,pos.super_Vector<double,_3U>.data_ + (uint)this->x_);
      pmVar21 = std::
                map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                ::operator[](local_1390,&globalIndex);
      std::vector<double,_std::allocator<double>_>::push_back
                (pmVar21,pos.super_Vector<double,_3U>.data_ + (uint)this->y_);
      pmVar20 = std::
                map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                operator[](local_1358,&globalIndex);
      *pmVar20 = local_1430;
      pmVar19 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](local_1410,&globalIndex);
      *pmVar19 = *pmVar19 + 1;
      std::_Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~_Vector_base
                (&atChain.
                  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>);
      std::__cxx11::string::~string((string *)&atomName);
      this_03 = SelectionManager::nextSelected(local_1368,&kk);
    }
    for (p_Var16 = (this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        ; p_Var16 != local_1350; p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
      pos.super_Vector<double,_3U>.data_[0] =
           (double)CONCAT44(pos.super_Vector<double,_3U>.data_[0]._4_4_,p_Var16[1]._M_color);
      std::__cxx11::string::string((string *)&atomName,(string *)&p_Var16[1]._M_parent);
      pmVar19 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[](this_01,&atomName);
      iVar14 = *pmVar19;
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                ::operator[](local_13b0,&atomName);
      local_1400 = *pmVar20;
      pmVar21 = std::
                map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                ::operator[](local_13a0,(key_type *)&pos);
      local_1408 = *(pmVar21->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      pmVar19 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[](this_01,&atomName);
      iVar7 = *pmVar19;
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                ::operator[](local_13b0,&atomName);
      *pmVar20 = ((double)iVar14 * local_1400 + local_1408) / (double)(iVar7 + 1);
      pmVar19 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[](this_01,&atomName);
      *pmVar19 = *pmVar19 + 1;
      std::__cxx11::string::~string((string *)&atomName);
    }
    iVar14 = local_13b8._0_4_ + (this->super_StaticAnalyser).step_;
  } while( true );
}

Assistant:

void ChargeDensityZ::process() {
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames_ = reader.getNFrames();
    nProcessed_  = nFrames_ / step_;

    // test using global index starts hereby

    reader.readFrame(1);
    currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

    hmat_ = currentSnapshot_->getHmat();
    zBox_.push_back(hmat_(axis_, axis_));

    std::vector<RealType>::iterator j;
    RealType zSum = 0.0;
    for (j = zBox_.begin(); j != zBox_.end(); ++j) {
      zSum += *j;
    }

    RealType zAve = zSum / zBox_.size();
    set<int> axisValues;
    axisValues.insert(0);
    axisValues.insert(1);
    axisValues.insert(2);
    axisValues.erase(axis_);
    set<int>::iterator axis_it;
    std::vector<int> cartesian_axis;
    for (axis_it = axisValues.begin(); axis_it != axisValues.end(); ++axis_it) {
      cartesian_axis.push_back(*axis_it);
    }
    x_                   = cartesian_axis[0];
    y_                   = cartesian_axis[1];
    RealType area        = hmat_(x_, x_) * hmat_(y_, y_);
    RealType sliceVolume = zAve / densityZAverageAllFrame_.size() * area;

    for (int i = 1; i < nFrames_; i += step_) {
      reader.readFrame(i);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      int kk;
      for (StuntDouble* sd = seleMan_.beginSelected(kk); sd != NULL;
           sd              = seleMan_.nextSelected(kk)) {
        if (!sd->isAtom()) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not calculate charge density distribution if it is not "
                   "atom\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        RealType q = 0.0;
        Atom* atom = static_cast<Atom*>(sd);

        AtomType* atomType = atom->getAtomType();

        if (sd->isAtom()) {
          FixedChargeAdapter fca = FixedChargeAdapter(atomType);
          if (fca.isFixedCharge()) { q += fca.getCharge(); }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
          if (fqa.isFluctuatingCharge()) { q += atom->getFlucQPos(); }
        }
        int obanum(0);
        RealType sigma(0);
        std::string atomName;
        std::vector<AtomType*> atChain = atomType->allYourBase();
        std::vector<AtomType*>::iterator i;
        for (i = atChain.begin(); i != atChain.end(); ++i) {
          atomName = (*i)->getName().c_str();
          obanum   = etab.GetAtomicNum((*i)->getName().c_str());
          if (obanum != 0) {
            sigma = etab.GetVdwRad(obanum);
            break;
          }
        }
        if (obanum == 0) { sigma = vRadius_; }

        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);

        pos = sd->getPos();

        int globalIndex = sd->getGlobalIndex();

        atomNameGlobalIndex_[globalIndex] = atomName;
        averageChargeUsingGlobalIndex_[globalIndex] =
            (countUsingGlobalIndex_[globalIndex] *
                 averageChargeUsingGlobalIndex_[globalIndex] +
             q) /
            (countUsingGlobalIndex_[globalIndex] + 1);
        totalChargeUsingGlobalIndex_[globalIndex].push_back(q);
        zPosUsingGlobalIndex_[globalIndex].push_back(pos[axis_]);
        xPosUsingGlobalIndex_[globalIndex].push_back(pos[x_]);
        yPosUsingGlobalIndex_[globalIndex].push_back(pos[y_]);

        vanderRUsingGlobalIndex_[globalIndex] = sigma;
        countUsingGlobalIndex_[globalIndex]++;
      }

      for (std::map<int, std::string>::iterator it =
               atomNameGlobalIndex_.begin();
           it != atomNameGlobalIndex_.end(); ++it) {
        int g_Index        = it->first;
        std::string a_name = it->second;
        averageChargeForEachType_[a_name] =
            (SDCount_[a_name] * averageChargeForEachType_[a_name] +
             totalChargeUsingGlobalIndex_[g_Index].front()) /
            (SDCount_[a_name] + 1);
        SDCount_[a_name]++;
      }
    }
    RealType epsilon = 1e-10;
    for (std::map<int, std::string>::iterator it = atomNameGlobalIndex_.begin();
         it != atomNameGlobalIndex_.end(); ++it) {
      int key            = it->first;
      std::string a_name = it->second;

      RealType averageCharge = averageChargeUsingGlobalIndex_[key];
      RealType averageChargeUsingFirstFrame = averageChargeForEachType_[a_name];
      RealType v_radius                     = vanderRUsingGlobalIndex_[key];
      RealType v_radius2                    = v_radius * v_radius;
      for (size_t index = 0; index < zPosUsingGlobalIndex_[key].size();
           ++index) {
        RealType z_pos  = zPosUsingGlobalIndex_[key][index];
        RealType charge = totalChargeUsingGlobalIndex_[key][index];
        RealType chargeDiff =
            fabs(charge - averageCharge) > epsilon ? charge - averageCharge : 0;
        RealType chargeDiffUsingFirstFrameAverage =
            fabs(charge - averageChargeUsingFirstFrame) > epsilon ?
                charge - averageChargeUsingFirstFrame :
                0;

        for (size_t i = 0; i < densityFlucZAverageAllFrame_.size(); ++i) {
          RealType z = -zAve / 2 + i * zAve / densityZAverageAllFrame_.size();
          RealType zdist = z_pos - z;

          RealType gaussian_scale =
              exp(-zdist * zdist / (v_radius2 * 2.0)) /
              (sliceVolume * (sqrt(2 * Constants::PI * v_radius * v_radius)));
          densityZAverageAllFrame_[i] += charge * gaussian_scale;

          densityFlucZAverageAllFrame_[i] += chargeDiff * gaussian_scale;
          absDensityFlucZAverageAllFrame_[i] +=
              abs(chargeDiff) * abs(chargeDiff) * gaussian_scale;

          densityFlucZAverageFirstFrame_[i] +=
              chargeDiffUsingFirstFrameAverage * gaussian_scale;
          absDensityFlucZAverageFirstFrame_[i] +=
              abs(chargeDiffUsingFirstFrameAverage) *
              abs(chargeDiffUsingFirstFrameAverage) * gaussian_scale;
        }
      }
    }

    writeDensity();

    if (genXYZ_) generateXYZForLastFrame();
  }